

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O1

uint8_t * __thiscall hrgls::datablob::DataBlob::Data(DataBlob *this)

{
  hrgls_DataBlob phVar1;
  hrgls_Status hVar2;
  uint8_t *ret;
  uint32_t size;
  uint8_t *local_20;
  undefined1 local_14 [4];
  
  local_20 = (uint8_t *)0x0;
  phVar1 = this->m_private->blob;
  if (phVar1 == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3ee;
    local_20 = (uint8_t *)0x0;
  }
  else {
    hVar2 = hrgls_DataBlobGetData(phVar1,&local_20,local_14);
    this->m_private->status = hVar2;
  }
  return local_20;
}

Assistant:

const uint8_t * DataBlob::Data() const
    {
      const uint8_t *ret = nullptr;
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      uint32_t size;
      m_private->status = hrgls_DataBlobGetData(m_private->blob, &ret, &size);
      return ret;
    }